

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,literal_expression *e)

{
  token_type tVar1;
  long *plVar2;
  undefined4 uVar3;
  wostream *pwVar4;
  wstring_view *s;
  char *pcVar5;
  wostringstream _woss;
  wchar_t *local_1b8;
  uint64_t local_1b0;
  wstring_view local_198;
  wstring local_188 [11];
  
  tVar1 = (e->t_).type_;
  if (0x47 < (int)tVar1) {
    if (tVar1 == false_) {
      pwVar4 = this->os_;
      pcVar5 = "false";
    }
    else if (tVar1 == true_) {
      pwVar4 = this->os_;
      pcVar5 = "true";
    }
    else {
      if (tVar1 != null_) goto LAB_001254ca;
      pwVar4 = this->os_;
      pcVar5 = "null";
    }
    std::operator<<(pwVar4,pcVar5);
    return;
  }
  if (tVar1 == numeric_literal) {
    std::wostream::_M_insert<double>((e->t_).field_1.dvalue_);
    return;
  }
  if (tVar1 == string_literal) {
    pwVar4 = this->os_;
    plVar2 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
    if (plVar2 == (long *)0x0) {
      std::__throw_bad_cast();
    }
    local_188[0]._M_dataplus._M_p._0_4_ = (**(code **)(*plVar2 + 0x50))(plVar2,0x22);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,(wchar_t *)local_188,1)
    ;
    tVar1 = (e->t_).type_;
    if ((tVar1 != identifier) && (tVar1 != string_literal)) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    local_1b0 = (e->t_).field_1.ivalue_;
    local_1b8 = (wchar_t *)(e->t_).field_1.text_._M_string_length;
    cpp_quote_abi_cxx11_(local_188,(mjs *)&local_1b8,s);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar4,(wchar_t *)
                               CONCAT44(local_188[0]._M_dataplus._M_p._4_4_,
                                        local_188[0]._M_dataplus._M_p._0_4_),
                        local_188[0]._M_string_length);
    plVar2 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      uVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,0x22);
      local_198._M_len = CONCAT44(local_198._M_len._4_4_,uVar3);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,(wchar_t *)&local_198,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)CONCAT44(local_188[0]._M_dataplus._M_p._4_4_,local_188[0]._M_dataplus._M_p._0_4_) !=
          &local_188[0].field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_188[0]._M_dataplus._M_p._4_4_,
                                 local_188[0]._M_dataplus._M_p._0_4_),
                        local_188[0].field_2._M_allocated_capacity * 4 + 4);
      }
      return;
    }
    std::__throw_bad_cast();
  }
LAB_001254ca:
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_188);
  pwVar4 = std::operator<<((wostream *)local_188,"Not implemented: ");
  (*(e->super_expression).super_syntax_node._vptr_syntax_node[2])(e,pwVar4);
  std::__cxx11::wstringbuf::str();
  local_198._M_len = local_1b0;
  local_198._M_str = local_1b8;
  throw_runtime_error(&local_198,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                      ,0x20);
}

Assistant:

void operator()(const literal_expression& e) {
        switch (e.t().type()) {
        case token_type::null_:            os_ << "null"; return;
        case token_type::true_:            os_ << "true"; return;
        case token_type::false_:           os_ << "false"; return;
        case token_type::numeric_literal:  os_ << e.t().dvalue(); return;
        case token_type::string_literal:   os_ << '"' << cpp_quote(e.t().text()) << '"'; return;
        default:
            NOT_IMPLEMENTED(e);
        }
    }